

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void test_read_format_zip_bzip2_multi(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_31e64;
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ʝ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_bzip2((archive *)ae);
  if (iVar1 == 0) {
    extract_reference_file((char *)a);
    wVar2 = archive_read_support_format_zip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʥ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",ae);
    wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x25);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʦ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 37)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_format_name((archive *)ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʩ',"ZIP 4.6 (bzip)","\"ZIP 4.6 (bzip)\"",pcVar3,"archive_format_name(a)",
               (void *)0x0,L'\0');
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʪ',"smartd.conf","\"smartd.conf\"",pcVar3,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    iVar1 = extract_one((archive *)ae,local_20,0x8dd7379e);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʫ',0,"0",(long)iVar1,"extract_one(a, ae, 0x8DD7379E)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_format_name((archive *)ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʮ',"ZIP 4.6 (bzip)","\"ZIP 4.6 (bzip)\"",pcVar3,"archive_format_name(a)",
               (void *)0x0,L'\0');
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʯ',"ts.conf","\"ts.conf\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
    iVar1 = extract_one((archive *)ae,local_20,0x7ae59b31);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʰ',0,"0",(long)iVar1,"extract_one(a, ae, 0x7AE59B31)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʲ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_format_name((archive *)ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʳ',"ZIP 4.6 (bzip)","\"ZIP 4.6 (bzip)\"",pcVar3,"archive_format_name(a)",
               (void *)0x0,L'\0');
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʴ',"vimrc","\"vimrc\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar1 = extract_one((archive *)ae,local_20,0xba8e3baa);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʵ',0,"0",(long)iVar1,"extract_one(a, ae, 0xBA8E3BAA)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʷ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    iVar1 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʸ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
    iVar1 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ʹ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",ae);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ʟ');
    test_skipping("bzip2 is not fully supported on this platform");
    archive_read_close((archive *)ae);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_bzip2_multi)
{
	const char *refname = "test_read_format_zip_bzip2_multi.zipx";
	struct archive *a;
	struct archive_entry *ae;

	assert((a = archive_read_new()) != NULL);
	if (ARCHIVE_OK != archive_read_support_filter_bzip2(a)) {
		skipping("bzip2 is not fully supported on this platform");
		archive_read_close(a);
		return;
	}
	extract_reference_file(refname);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 37));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 4.6 (bzip)", archive_format_name(a));
	assertEqualString("smartd.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0x8DD7379E));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 4.6 (bzip)", archive_format_name(a));
	assertEqualString("ts.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0x7AE59B31));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 4.6 (bzip)", archive_format_name(a));
	assertEqualString("vimrc", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0xBA8E3BAA));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}